

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O3

Json * Json::parseFile(Json *__return_storage_ptr__,string *path_to_file)

{
  char cVar1;
  istream *piVar2;
  char *__end;
  string s;
  string result;
  ifstream file_with_json;
  long *local_278 [2];
  long local_268 [2];
  string local_258;
  long local_238 [65];
  
  local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_258," ","");
  local_278[0] = local_268;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_278," ","");
  std::ifstream::ifstream((istream *)local_238,(string *)path_to_file,_S_in);
  while( true ) {
    cVar1 = std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) + (char)(istream *)local_238
                           );
    piVar2 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)local_238,(string *)local_278,cVar1);
    if (((byte)piVar2[*(long *)(*(long *)piVar2 + -0x18) + 0x20] & 5) != 0) break;
    std::__cxx11::string::_M_append((char *)&local_258,(ulong)local_278[0]);
  }
  Json(__return_storage_ptr__,&local_258);
  std::ifstream::~ifstream(local_238);
  if (local_278[0] != local_268) {
    operator_delete(local_278[0],local_268[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_dataplus._M_p != &local_258.field_2) {
    operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

Json Json::parseFile(const string& path_to_file) {
	string result = " ";
	string s = " ";
	ifstream file_with_json(path_to_file);
	while (getline(file_with_json,s)) {
		result += s;
	}
	return parse(result);
}